

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_acolyte.cpp
# Opt level: O0

int AF_A_BeShadowyFoe(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  bool bVar1;
  bool local_52;
  bool local_4f;
  Self local_4c;
  void *local_48;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_18;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_18 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_acolyte.cpp"
                  ,0x5f,"int AF_A_BeShadowyFoe(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar1) {
    stateowner = (AActor *)(param->field_0).field_1.a;
    local_4f = true;
    if (stateowner != (AActor *)0x0) {
      local_4f = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
    }
    if (local_4f == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_acolyte.cpp"
                    ,0x5f,"int AF_A_BeShadowyFoe(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_18[(int)self].field_0.field_3.Type != 0xff)) {
      bVar1 = false;
      if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar1 = true, pVStack_18[(int)self].field_0.field_1.atag != 1)) {
        bVar1 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar1) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_acolyte.cpp"
                      ,0x5f,"int AF_A_BeShadowyFoe(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
      stateinfo = (FStateParamInfo *)pVStack_18[(int)self].field_0.field_1.a;
      local_52 = true;
      if ((DObject *)stateinfo != (DObject *)0x0) {
        local_52 = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
      }
      if (local_52 == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_acolyte.cpp"
                      ,0x5f,"int AF_A_BeShadowyFoe(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
    }
    else {
      stateinfo = (FStateParamInfo *)stateowner;
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_18[(int)self].field_0.field_3.Type != 0xff)) {
      bVar1 = false;
      if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar1 = true, pVStack_18[(int)self].field_0.field_1.atag != 8)) {
        bVar1 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar1) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_acolyte.cpp"
                      ,0x5f,"int AF_A_BeShadowyFoe(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
      local_48 = pVStack_18[(int)self].field_0.field_1.a;
    }
    else {
      local_48 = (void *)0x0;
    }
    FRenderStyle::operator=((FRenderStyle *)&(stateowner->RenderStyle).field_0,STYLE_Translucent);
    stateowner->Alpha = 0.40625;
    operator~((EnumType)&local_4c);
    TFlags<ActorFlag,_unsigned_int>::operator&=(&stateowner->flags,&local_4c);
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_acolyte.cpp"
                ,0x5f,"int AF_A_BeShadowyFoe(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_BeShadowyFoe)
{
	PARAM_ACTION_PROLOGUE;

	self->RenderStyle = STYLE_Translucent;
	self->Alpha = HR_SHADOW;
	self->flags &= ~MF_FRIENDLY;
	return 0;
}